

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bwt_merger.hpp
# Opt level: O0

void __thiscall
bwt_merger<dna_bwt_n<dna_string_n>,_unsigned_int>::update_DA
          (bwt_merger<dna_bwt_n<dna_string_n>,_unsigned_int> *this,sa_leaf L1,sa_leaf L2,
          bool compute_lcp,uint64_t *lcp_values,uint64_t *m)

{
  reference pvVar1;
  long *in_RCX;
  long *in_RDX;
  byte in_SIL;
  size_type in_RDI;
  long in_stack_00000008;
  long in_stack_00000010;
  value_type in_stack_00000018;
  long in_stack_00000020;
  uint64_t i_2;
  uint64_t i_1;
  uint64_t i;
  uint64_t end;
  uint64_t start2;
  uint64_t start1;
  vector<bool,_std::allocator<bool>_> *in_stack_ffffffffffffff90;
  size_type __n;
  reference local_68;
  ulong local_58;
  reference local_50;
  ulong local_40;
  ulong local_38;
  ulong local_30;
  size_type local_28;
  long *local_20;
  long *local_18;
  byte local_9;
  
  local_9 = in_SIL & 1;
  local_30 = in_stack_00000020 + in_stack_00000010;
  local_38 = in_stack_00000010 + i_2;
  local_40 = in_stack_00000008 + in_stack_00000020;
  local_28 = local_40;
  local_20 = in_RCX;
  local_18 = in_RDX;
  for (; local_40 < local_30; local_40 = local_40 + 1) {
    local_50 = std::vector<bool,_std::allocator<bool>_>::operator[]
                         (in_stack_ffffffffffffff90,in_RDI);
    std::_Bit_reference::operator=(&local_50,false);
    *local_20 = *local_20 + 1;
  }
  for (local_58 = local_30; local_58 < local_38; local_58 = local_58 + 1) {
    local_68 = std::vector<bool,_std::allocator<bool>_>::operator[]
                         (in_stack_ffffffffffffff90,in_RDI);
    std::_Bit_reference::operator=(&local_68,true);
    *local_20 = *local_20 + 1;
  }
  __n = local_28;
  if ((local_9 & 1) != 0) {
    while (__n = __n + 1, __n < local_38) {
      pvVar1 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                         ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)(in_RDI + 0x28),__n
                         );
      *pvVar1 = in_stack_00000018;
      *local_18 = *local_18 + 1;
    }
  }
  return;
}

Assistant:

void update_DA(sa_leaf L1,sa_leaf L2, bool compute_lcp, uint64_t & lcp_values, uint64_t & m){

		uint64_t start1 = L1.rn.first + L2.rn.first;//start position of first interval in merged intervals
		uint64_t start2 = L2.rn.first + L1.rn.second;//start position of second interval in merged intervals
		uint64_t end = L1.rn.second + L2.rn.second;//end position (excluded) of merged intervals

		assert(end>start1);

		for(uint64_t i = start1; i<start2; ++i){
			DA[i] = 0;
			m++;
		}

		for(uint64_t i = start2; i<end; ++i){
			DA[i] = 1;
			m++;
		}

		assert(L1.depth==L2.depth);

		if(compute_lcp){

			for(uint64_t i = start1+1; i<end; ++i){

				assert(LCP[i]==nil);

				LCP[i] = L1.depth;

				lcp_values++;

			}

		}

		assert(m<=n);

	}